

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void process_bb_ranges(gen_ctx_t gen_ctx,bb_t_conflict bb,MIR_insn_t start_insn,MIR_insn_t tail_insn
                      )

{
  int *piVar1;
  bitmap_t pVVar2;
  ulong *puVar3;
  bitmap_el_t *__s2;
  MIR_context_t ctx;
  FILE *pFVar4;
  void *pvVar5;
  gen_ctx_t bm;
  void **ppvVar6;
  int iVar7;
  uint uVar8;
  MIR_type_t tp;
  bitmap_t pVVar9;
  lr_bb_t_conflict plVar10;
  char *pcVar11;
  lr_ctx *plVar12;
  live_range_t_conflict plVar13;
  int start;
  ulong uVar14;
  bitmap_t pVVar15;
  VARR_live_range_t *pVVar16;
  live_range_t_conflict *pplVar17;
  MIR_item_t pMVar18;
  int extraout_EDX;
  int extraout_EDX_00;
  uint extraout_EDX_01;
  size_t sVar19;
  MIR_reg_t *pMVar20;
  MIR_op_t *pMVar21;
  MIR_op_t *pMVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  live_range_t_conflict plVar26;
  live_range_t_conflict nb;
  gen_ctx_t pgVar27;
  char *pcVar28;
  gen_ctx_t pgVar29;
  int iVar30;
  undefined8 in_R8;
  ulong uVar31;
  MIR_reg_t MVar32;
  bool bVar33;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  int local_5c;
  anon_union_32_12_57d33f68_for_u *local_58;
  uint local_4c;
  MIR_reg_t local_48;
  MIR_reg_t local_44;
  MIR_op_t *local_40;
  MIR_insn_t local_38;
  
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"  ------BB%u end: point=%d\n",(ulong)(uint)bb->index,
            (ulong)(uint)gen_ctx->lr_ctx->curr_point);
  }
  plVar12 = gen_ctx->lr_ctx;
  pVVar2 = plVar12->referenced_vars;
  if ((pVVar2 == (bitmap_t)0x0) || (pVVar2->varr == (bitmap_el_t *)0x0)) {
LAB_0016d73a:
    process_bb_ranges_cold_14();
  }
  else {
    pVVar2->els_num = 0;
    pVVar2 = plVar12->live_vars;
    if ((pVVar2 != (bitmap_t)0x0) && (pVVar2->varr != (bitmap_el_t *)0x0)) {
      pVVar2->els_num = 0;
      pVVar2 = bb->out;
      local_38 = start_insn;
      if ((pVVar2 != (bitmap_t)0x0) && (uVar23 = pVVar2->els_num, uVar23 != 0)) {
        uVar14 = 0;
        uVar31 = 0;
        do {
          while ((pVVar2->varr[uVar14] == 0 ||
                 (uVar25 = pVVar2->varr[uVar14] >> (uVar31 & 0x3f), uVar25 == 0))) {
            uVar14 = uVar14 + 1;
            uVar31 = uVar14 * 0x40;
            if (uVar23 == uVar14) goto LAB_0016ce78;
          }
          uVar23 = uVar25 & 1;
          while (uVar23 == 0) {
            uVar31 = uVar31 + 1;
            uVar23 = uVar25 & 2;
            uVar25 = uVar25 >> 1;
          }
          iVar7 = (int)uVar31;
          uVar31 = uVar31 + 1;
          MVar32 = scan_var_to_var((gen_ctx_t)gen_ctx->lr_ctx,iVar7);
          in_R8 = 0;
          make_var_live(gen_ctx,MVar32,iVar7,gen_ctx->lr_ctx->curr_point,0);
          uVar23 = pVVar2->els_num;
          uVar14 = uVar31 >> 6;
        } while (uVar14 < uVar23);
      }
LAB_0016ce78:
      do {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fprintf((FILE *)gen_ctx->debug_file,"  p%-5d",(ulong)(uint)gen_ctx->lr_ctx->curr_point);
          in_R8 = 1;
          MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,tail_insn,
                          (gen_ctx->curr_func_item->u).func,1);
        }
        if ((int)*(ulong *)&tail_insn->field_0x18 == 0xba) {
          iVar7 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,tail_insn->ops[0].u.reg);
          if (-1 < iVar7) {
            in_R8 = 1;
            make_var_dead(gen_ctx,tail_insn->ops[0].u.reg,iVar7,gen_ctx->lr_ctx->curr_point,1);
            piVar1 = &gen_ctx->lr_ctx->curr_point;
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
          local_40 = tail_insn->ops;
          uVar31 = *(ulong *)&tail_insn->field_0x18 >> 0x20;
          uVar23 = 0;
          bVar33 = false;
          local_58 = &tail_insn->ops[0].u;
          local_4c = (uint)CONCAT71((int7)((ulong)local_58 >> 8),1);
          while (uVar23 < uVar31) {
            pMVar20 = (MIR_reg_t *)(uVar23 * 0x30 + (long)local_58);
            uVar14 = uVar23;
            while ((MIR_insn_op_mode(gen_ctx->ctx,tail_insn,uVar14,&local_5c), local_5c == 0 ||
                   ((char)pMVar20[-2] == '\v'))) {
              uVar14 = uVar14 + 1;
              pMVar20 = pMVar20 + 0xc;
              if (uVar31 == uVar14) goto LAB_0016cfd9;
            }
            if ((char)pMVar20[-2] != '\x02') {
              __assert_fail("op_ref->mode == MIR_OP_VAR",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x4ff,
                            "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                           );
            }
            MVar32 = *pMVar20;
            uVar23 = uVar14 + 1;
            iVar7 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,MVar32);
            if (-1 < iVar7) {
              in_R8 = 1;
              bVar33 = true;
              make_var_dead(gen_ctx,MVar32,iVar7,gen_ctx->lr_ctx->curr_point,1);
              uVar23 = uVar14 + 1;
              local_4c = 0;
            }
          }
LAB_0016cfd9:
          if ((gen_ctx->lr_ctx->scan_vars_num == 0) &&
             (0xfffffffc < *(int *)&tail_insn->field_0x18 - 0xaaU)) {
            if ((local_4c & 1) == 0) {
              piVar1 = &gen_ctx->lr_ctx->curr_point;
              *piVar1 = *piVar1 + 1;
            }
            pVVar2 = gen_ctx->call_used_hard_regs[0x12];
            if (pVVar2 != (bitmap_t)0x0) {
              uVar23 = pVVar2->els_num;
              if (uVar23 == 0) {
                bVar33 = false;
              }
              else {
                uVar14 = 0;
                uVar31 = 0;
                bVar33 = false;
                do {
                  while ((pVVar2->varr[uVar14] == 0 ||
                         (uVar25 = pVVar2->varr[uVar14] >> (uVar31 & 0x3f), uVar25 == 0))) {
                    uVar14 = uVar14 + 1;
                    uVar31 = uVar14 * 0x40;
                    if (uVar23 == uVar14) goto LAB_0016d0a4;
                  }
                  uVar23 = uVar25 & 1;
                  uVar14 = uVar31;
                  while (uVar23 == 0) {
                    uVar14 = uVar14 + 1;
                    uVar23 = uVar25 & 2;
                    uVar25 = uVar25 >> 1;
                  }
                  in_R8 = 1;
                  uVar31 = uVar14 + 1;
                  bVar33 = true;
                  make_var_dead(gen_ctx,(MIR_reg_t)uVar14,(MIR_reg_t)uVar14,
                                gen_ctx->lr_ctx->curr_point,1);
                  uVar23 = pVVar2->els_num;
                  uVar14 = uVar31 >> 6;
                } while (uVar14 < uVar23);
              }
LAB_0016d0a4:
              puVar3 = *(ulong **)
                        ((long)tail_insn->data + (ulong)(gen_ctx->optimize_level != 0) * 0x40 + 8);
              if ((puVar3 != (ulong *)0x0) && (uVar23 = *puVar3, uVar23 != 0)) {
                uVar14 = 0;
                uVar31 = 0;
                do {
                  while ((uVar25 = *(ulong *)(puVar3[2] + uVar14 * 8), uVar25 == 0 ||
                         (uVar25 = uVar25 >> (uVar31 & 0x3f), uVar25 == 0))) {
                    uVar14 = uVar14 + 1;
                    uVar31 = uVar14 * 0x40;
                    if (uVar23 == uVar14) goto LAB_0016d13a;
                  }
                  uVar23 = uVar25 & 1;
                  uVar14 = uVar31;
                  while (uVar23 == 0) {
                    uVar14 = uVar14 + 1;
                    uVar23 = uVar25 & 2;
                    uVar25 = uVar25 >> 1;
                  }
                  in_R8 = 1;
                  uVar31 = uVar14 + 1;
                  make_var_live(gen_ctx,(MIR_reg_t)uVar14,(MIR_reg_t)uVar14,
                                gen_ctx->lr_ctx->curr_point,1);
                  uVar23 = *puVar3;
                  uVar14 = uVar31 >> 6;
                } while (uVar14 < uVar23);
              }
LAB_0016d13a:
              pVVar2 = gen_ctx->lr_ctx->live_vars;
              if (pVVar2 != (bitmap_t)0x0) {
                uVar23 = pVVar2->els_num;
                if (uVar23 != 0) {
                  uVar14 = 0;
                  uVar31 = 0;
                  do {
                    while ((pVVar2->varr[uVar14] == 0 ||
                           (uVar25 = pVVar2->varr[uVar14] >> (uVar31 & 0x3f), uVar25 == 0))) {
                      uVar14 = uVar14 + 1;
                      uVar31 = uVar14 * 0x40;
                      if (uVar23 == uVar14) goto LAB_0016d1fe;
                    }
                    uVar23 = uVar25 & 1;
                    while (uVar23 == 0) {
                      uVar31 = uVar31 + 1;
                      uVar23 = uVar25 & 2;
                      uVar25 = uVar25 >> 1;
                    }
                    if (0x21 < uVar31) {
                      pVVar15 = gen_ctx->curr_cfg->call_crossed_regs;
                      bitmap_expand(pVVar15,(uVar31 & 0xffffffff) + 1);
                      if (pVVar15 == (bitmap_t)0x0) goto LAB_0016d75d;
                      pVVar15->varr[uVar31 >> 6 & 0x3ffffff] =
                           pVVar15->varr[uVar31 >> 6 & 0x3ffffff] | 1L << (uVar31 & 0x3f);
                    }
                    uVar23 = pVVar2->els_num;
                    uVar31 = uVar31 + 1;
                    uVar14 = uVar31 >> 6;
                  } while (uVar14 < uVar23);
                }
                goto LAB_0016d1fe;
              }
              process_bb_ranges_cold_2();
            }
            process_bb_ranges_cold_3();
            goto LAB_0016d73a;
          }
LAB_0016d1fe:
          if (bVar33) {
            piVar1 = &gen_ctx->lr_ctx->curr_point;
            *piVar1 = *piVar1 + 1;
          }
          uVar24 = *(uint *)&tail_insn->field_0x1c;
          sVar19 = 0;
          uVar23 = 0;
          local_58 = (anon_union_32_12_57d33f68_for_u *)((ulong)local_58 & 0xffffffff00000000);
          while (pMVar22 = local_40, sVar19 < uVar24) {
LAB_0016d22c:
            MIR_insn_op_mode(gen_ctx->ctx,tail_insn,sVar19,&local_5c);
            if ((local_5c != 0) && (pMVar22[sVar19].field_0x8 != '\v')) goto LAB_0016d2a1;
            pMVar21 = pMVar22;
            if (1 < uVar23) {
LAB_0016d29e:
              uVar23 = 0;
              pMVar22 = pMVar21;
LAB_0016d2a1:
              sVar19 = sVar19 + 1;
              if (sVar19 == uVar24) break;
              goto LAB_0016d22c;
            }
            if (pMVar22[sVar19].field_0x8 == '\v') {
              do {
                MVar32 = *(MIR_reg_t *)((long)&pMVar22[sVar19].u + (ulong)(uVar23 != 0) * 4 + 0x10);
                if (MVar32 != 0xffffffff) {
                  uVar23 = uVar23 + 1;
                  goto LAB_0016d2ae;
                }
                bVar33 = uVar23 == 0;
                uVar23 = 1;
                pMVar21 = local_40;
              } while (bVar33);
              goto LAB_0016d29e;
            }
            if (uVar23 == 1) goto LAB_0016d29e;
            uVar23 = 0;
            if (pMVar22[sVar19].field_0x8 != '\x02') goto LAB_0016d2a1;
            MVar32 = pMVar22[sVar19].u.reg;
            uVar23 = 1;
LAB_0016d2ae:
            iVar7 = var_to_scan_var((gen_ctx_t)gen_ctx->lr_ctx,MVar32);
            if (-1 < iVar7) {
              in_R8 = 1;
              uVar8 = make_var_live(gen_ctx,MVar32,iVar7,gen_ctx->lr_ctx->curr_point,1);
              local_58 = (anon_union_32_12_57d33f68_for_u *)
                         CONCAT44(local_58._4_4_,(uint)local_58 | uVar8);
            }
          }
          plVar12 = gen_ctx->lr_ctx;
          if (plVar12->scan_vars_num == 0) {
            target_get_early_clobbered_hard_regs
                      (*(MIR_insn_t *)&tail_insn->field_0x18,&local_44,&local_48);
            MVar32 = local_44;
            if (local_44 != 0xffffffff) {
              local_58 = (anon_union_32_12_57d33f68_for_u *)CONCAT44(local_58._4_4_,1);
              make_var_live(gen_ctx,local_44,local_44,plVar12->curr_point,1);
              in_R8 = 1;
              make_var_dead(gen_ctx,MVar32,MVar32,gen_ctx->lr_ctx->curr_point,1);
            }
            MVar32 = local_48;
            if (local_48 == 0xffffffff) goto LAB_0016d302;
            make_var_live(gen_ctx,local_48,local_48,gen_ctx->lr_ctx->curr_point,1);
            in_R8 = 1;
            make_var_dead(gen_ctx,MVar32,MVar32,gen_ctx->lr_ctx->curr_point,1);
          }
          else {
LAB_0016d302:
            start_insn = local_38;
            if ((uint)local_58 == 0) goto LAB_0016d3b8;
          }
          piVar1 = &gen_ctx->lr_ctx->curr_point;
          *piVar1 = *piVar1 + 1;
          start_insn = local_38;
        }
LAB_0016d3b8:
        if (tail_insn == start_insn) goto LAB_0016d3c6;
        tail_insn = (tail_insn->insn_link).prev;
      } while( true );
    }
  }
  process_bb_ranges_cold_13();
LAB_0016d744:
  process_bb_ranges_cold_12();
LAB_0016d749:
  process_bb_ranges_cold_11();
LAB_0016d74e:
  process_bb_ranges_cold_7();
LAB_0016d753:
  process_bb_ranges_cold_10();
LAB_0016d758:
  process_bb_ranges_cold_9();
LAB_0016d75d:
  process_bb_ranges_cold_1();
LAB_0016d762:
  process_bb_ranges_cold_8();
LAB_0016d767:
  process_bb_ranges_cold_4();
LAB_0016d76c:
  __assert_fail("lr != ((void*)0) && lr->lr_bb == ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x18a8,"void add_lr_bb(gen_ctx_t, MIR_reg_t, bb_t)");
LAB_0016d3c6:
  pVVar2 = bb->in;
  if (pVVar2 == (bitmap_t)0x0) goto LAB_0016d744;
  pVVar15 = gen_ctx->lr_ctx->live_vars;
  if (pVVar15 == (bitmap_t)0x0) goto LAB_0016d749;
  uVar23 = pVVar2->els_num;
  uVar31 = pVVar15->els_num;
  pVVar9 = pVVar2;
  uVar14 = uVar23;
  if (uVar31 < uVar23) {
    pVVar9 = pVVar15;
    pVVar15 = pVVar2;
    uVar14 = uVar31;
    uVar31 = uVar23;
  }
  __s2 = pVVar15->varr;
  iVar7 = bcmp(pVVar9->varr,__s2,uVar14 * 8);
  if (iVar7 != 0) {
LAB_0016d711:
    __assert_fail("bitmap_equal_p (bb->in, gen_ctx->lr_ctx->live_vars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1965,"void process_bb_ranges(gen_ctx_t, bb_t, MIR_insn_t, MIR_insn_t)");
  }
  if (uVar14 < uVar31) {
    do {
      if (__s2[uVar14] != 0) goto LAB_0016d711;
      uVar14 = uVar14 + 1;
    } while (uVar31 != uVar14);
  }
  if (uVar23 != 0) {
    uVar14 = 0;
    uVar31 = 0;
    do {
      while ((pVVar2->varr[uVar14] == 0 ||
             (uVar25 = pVVar2->varr[uVar14] >> (uVar31 & 0x3f), uVar25 == 0))) {
        uVar14 = uVar14 + 1;
        uVar31 = uVar14 * 0x40;
        if (uVar23 == uVar14) goto LAB_0016d582;
      }
      uVar23 = uVar25 & 1;
      while (uVar23 == 0) {
        uVar31 = uVar31 + 1;
        uVar23 = uVar25 & 2;
        uVar25 = uVar25 >> 1;
      }
      MVar32 = scan_var_to_var((gen_ctx_t)gen_ctx->lr_ctx,(int)uVar31);
      in_R8 = 0;
      pgVar27 = gen_ctx;
      make_var_dead(gen_ctx,MVar32,(int)uVar31,gen_ctx->lr_ctx->curr_point,0);
      plVar12 = gen_ctx->lr_ctx;
      if (plVar12->scan_vars_num == 0) {
        pVVar15 = plVar12->referenced_vars;
        if (pVVar15 == (bitmap_t)0x0) {
          process_bb_ranges_cold_5();
          goto LAB_0016d790;
        }
        if ((pVVar15->els_num << 6 <= uVar31) ||
           ((pVVar15->varr[uVar31 >> 6] >> (uVar31 & 0x3f) & 1) == 0)) {
          pVVar16 = plVar12->var_live_ranges;
          if ((pVVar16 == (VARR_live_range_t *)0x0) ||
             ((pVVar16->varr == (live_range_t_conflict *)0x0 ||
              (pVVar16->els_num <= (uVar31 & 0xffffffff))))) goto LAB_0016d767;
          plVar26 = pVVar16->varr[uVar31 & 0xffffffff];
          if ((plVar26 == (live_range_t_conflict)0x0) || (plVar26->lr_bb != (lr_bb_t_conflict)0x0))
          goto LAB_0016d76c;
          plVar10 = plVar12->free_lr_bb_list;
          if (plVar10 == (lr_bb_t_conflict)0x0) {
            plVar10 = (lr_bb_t_conflict)gen_malloc(gen_ctx,0x10);
          }
          else {
            plVar12->free_lr_bb_list = plVar10->next;
          }
          plVar10->bb = bb;
          plVar10->next = (lr_bb_t)0x0;
          plVar26->lr_bb = plVar10;
        }
      }
      uVar23 = pVVar2->els_num;
      uVar31 = uVar31 + 1;
      uVar14 = uVar31 >> 6;
    } while (uVar14 < uVar23);
  }
LAB_0016d582:
  plVar12 = gen_ctx->lr_ctx;
  if (plVar12->scan_vars_num != 0) {
LAB_0016d58f:
    pVVar2 = bb->in;
    if (pVVar2 != (bitmap_t)0x0) {
      if (pVVar2->els_num != 0) {
        sVar19 = 0;
        do {
          if (pVVar2->varr[sVar19] != 0) {
            piVar1 = &gen_ctx->lr_ctx->curr_point;
            *piVar1 = *piVar1 + 1;
            return;
          }
          sVar19 = sVar19 + 1;
        } while (pVVar2->els_num != sVar19);
      }
      return;
    }
    goto LAB_0016d74e;
  }
  pVVar2 = bb->gen;
  if ((pVVar2 == (bitmap_t)0x0) || (pVVar2->varr == (bitmap_el_t *)0x0)) goto LAB_0016d753;
  pVVar2->els_num = 0;
  pVVar2 = bb->kill;
  if ((pVVar2 != (bitmap_t)0x0) && (pVVar2->varr != (bitmap_el_t *)0x0)) {
    pVVar2->els_num = 0;
    pVVar2 = plVar12->referenced_vars;
    if (pVVar2 == (bitmap_t)0x0) goto LAB_0016d762;
    uVar23 = pVVar2->els_num;
    if (uVar23 != 0) {
      uVar14 = 0;
      uVar31 = 0;
      do {
        while ((pVVar2->varr[uVar14] == 0 ||
               (uVar25 = pVVar2->varr[uVar14] >> (uVar31 & 0x3f), uVar25 == 0))) {
          uVar14 = uVar14 + 1;
          uVar31 = uVar14 * 0x40;
          if (uVar23 == uVar14) goto LAB_0016d58f;
        }
        uVar23 = uVar25 & 1;
        uVar14 = uVar31;
        while (uVar23 == 0) {
          uVar14 = uVar14 + 1;
          uVar23 = uVar25 & 2;
          uVar25 = uVar25 >> 1;
        }
        uVar31 = uVar14 + 1;
        if (0x21 < uVar14) {
          pgVar29 = (gen_ctx_t)bb->kill;
          pgVar27 = pgVar29;
          bitmap_expand((bitmap_t)pgVar29,uVar31);
          if (pgVar29 == (gen_ctx_t)0x0) goto LAB_0016d790;
          ppvVar6 = &pgVar29->curr_func_item->data + (uVar14 >> 6);
          *ppvVar6 = (void *)((ulong)*ppvVar6 | 1L << (uVar14 & 0x3f));
        }
        uVar23 = pVVar2->els_num;
        uVar14 = uVar31 >> 6;
      } while (uVar14 < uVar23);
    }
    goto LAB_0016d58f;
  }
  goto LAB_0016d758;
LAB_0016d790:
  process_bb_ranges_cold_6();
  ctx = pgVar27->ctx;
  pcVar28 = "+++++++++++++Live ranges:\n";
  plVar26 = (live_range_t_conflict)0x1a;
  fwrite("+++++++++++++Live ranges:\n",0x1a,1,(FILE *)pgVar27->debug_file);
  plVar12 = pgVar27->lr_ctx;
  pVVar16 = plVar12->var_live_ranges;
  if (pVVar16 != (VARR_live_range_t *)0x0) {
    uVar23 = 0;
    do {
      iVar7 = (int)in_R8;
      if (pVVar16->els_num <= uVar23) {
        return;
      }
      pplVar17 = pVVar16->varr;
      if (pplVar17 == (live_range_t_conflict *)0x0) {
        print_all_live_ranges_cold_1();
        plVar12 = ((gen_ctx_t)pcVar28)->lr_ctx;
        start = (int)pplVar17;
        pVVar16 = plVar12->var_live_ranges;
        iVar30 = iVar7;
        if (((pVVar16 == (VARR_live_range_t *)0x0) ||
            (pVVar16->varr == (live_range_t_conflict *)0x0)) ||
           (uVar23 = (ulong)plVar26 & 0xffffffff, pVVar16->els_num <= uVar23)) {
          make_var_live_cold_4();
LAB_0016da3f:
          make_var_live_cold_2();
          nb = plVar26;
          pgVar29 = (gen_ctx_t)pcVar28;
LAB_0016da44:
          make_var_live_cold_3();
        }
        else {
          plVar13 = pVVar16->varr[uVar23];
          if ((iVar7 == 0) || (plVar12->scan_vars_num != 0)) {
LAB_0016d983:
            pgVar27 = (gen_ctx_t)plVar12->live_vars;
            uVar31 = (ulong)extraout_EDX;
            nb = (live_range_t_conflict)(uVar31 + 1);
            pgVar29 = pgVar27;
            bitmap_expand((bitmap_t)pgVar27,(size_t)nb);
            if (pgVar27 != (gen_ctx_t)0x0) {
              pvVar5 = (&pgVar27->curr_func_item->data)[uVar31 >> 6];
              (&pgVar27->curr_func_item->data)[uVar31 >> 6] =
                   (void *)((ulong)pvVar5 | 1L << (uVar31 & 0x3f));
              if ((((ulong)pvVar5 >> (uVar31 & 0x3f) & 1) != 0) ||
                 (((iVar7 != 0 && (plVar13 != (live_range_t_conflict)0x0)) &&
                  ((plVar13->lr_bb == (lr_bb_t_conflict)0x0 &&
                   (plVar13->finish + 1 == start || plVar13->finish == start)))))) {
                return;
              }
              plVar26 = (live_range_t_conflict)((ulong)pplVar17 & 0xffffffff);
              pVVar16 = ((gen_ctx_t)pcVar28)->lr_ctx->var_live_ranges;
              plVar13 = create_live_range((gen_ctx_t)pcVar28,start,-1,plVar13);
              if (((pVVar16 != (VARR_live_range_t *)0x0) &&
                  (pVVar16->varr != (live_range_t_conflict *)0x0)) && (uVar23 < pVVar16->els_num)) {
                pVVar16->varr[uVar23] = plVar13;
                return;
              }
              goto LAB_0016da3f;
            }
            goto LAB_0016da44;
          }
          pgVar27 = (gen_ctx_t)plVar12->referenced_vars;
          nb = (live_range_t_conflict)(uVar23 + 1);
          pgVar29 = pgVar27;
          bitmap_expand((bitmap_t)pgVar27,(size_t)nb);
          if (pgVar27 != (gen_ctx_t)0x0) {
            ppvVar6 = &pgVar27->curr_func_item->data + (uVar23 >> 6);
            *ppvVar6 = (void *)((ulong)*ppvVar6 | 1L << ((ulong)plVar26 & 0x3f));
            plVar12 = ((gen_ctx_t)pcVar28)->lr_ctx;
            goto LAB_0016d983;
          }
        }
        make_var_live_cold_1();
        if (*(int *)((long)&pgVar29->ctx + 4) == 0) {
          return;
        }
        if ((int)nb < 0) {
LAB_0016da80:
          __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
        }
        pMVar18 = pgVar29->curr_func_item;
        if (pMVar18 == (MIR_item_t)0x0) {
          scan_var_to_var_cold_2();
        }
        else {
          ppvVar6 = &pMVar18->data;
          if ((int)*ppvVar6 <= (int)nb) goto LAB_0016da80;
          pMVar18 = (pMVar18->item_link).prev;
          if ((pMVar18 != (MIR_item_t)0x0) && ((void *)((ulong)nb & 0xffffffff) < *ppvVar6)) {
            return;
          }
        }
        scan_var_to_var_cold_1();
        uVar24 = (uint)nb;
        uVar8 = (uint)pMVar18;
        uVar23 = (ulong)nb & 0xffffffff;
        pgVar27 = pgVar29;
        if ((iVar30 != 0) && (pgVar29->lr_ctx->scan_vars_num == 0)) {
          bm = (gen_ctx_t)pgVar29->lr_ctx->referenced_vars;
          sVar19 = uVar23 + 1;
          pgVar27 = bm;
          bitmap_expand((bitmap_t)bm,sVar19);
          uVar24 = (uint)sVar19;
          if (bm == (gen_ctx_t)0x0) goto LAB_0016db94;
          pMVar18 = (MIR_item_t)(uVar23 >> 6);
          ppvVar6 = &bm->curr_func_item->data + (long)pMVar18;
          *ppvVar6 = (void *)((ulong)*ppvVar6 | 1L << ((ulong)nb & 0x3f));
        }
        pVVar16 = pgVar29->lr_ctx->var_live_ranges;
        if (((pVVar16 == (VARR_live_range_t *)0x0) ||
            (pMVar18 = (MIR_item_t)pVVar16->varr, pMVar18 == (MIR_item_t)0x0)) ||
           (pVVar16->els_num <= uVar23)) {
          make_var_dead_cold_4();
LAB_0016db8a:
          make_var_dead_cold_2();
        }
        else {
          pVVar2 = pgVar29->lr_ctx->live_vars;
          if (pVVar2 != (bitmap_t)0x0) {
            plVar26 = (live_range_t_conflict)(&pMVar18->data)[uVar23];
            uVar31 = (ulong)extraout_EDX_00;
            if ((uVar31 < pVVar2->els_num << 6) &&
               (uVar14 = pVVar2->varr[uVar31 >> 6],
               pVVar2->varr[uVar31 >> 6] = uVar14 & ~(1L << (uVar31 & 0x3f)),
               (uVar14 >> (uVar31 & 0x3f) & 1) != 0)) {
              plVar26->finish = uVar8;
              return;
            }
            uVar24 = uVar8;
            plVar26 = create_live_range(pgVar29,uVar8,uVar8,plVar26);
            pMVar18 = (MIR_item_t)pVVar16->varr;
            pgVar27 = pgVar29;
            if ((pMVar18 != (MIR_item_t)0x0) && (uVar23 < pVVar16->els_num)) {
              (&pMVar18->data)[uVar23] = plVar26;
              return;
            }
            goto LAB_0016db8a;
          }
        }
        make_var_dead_cold_3();
LAB_0016db94:
        make_var_dead_cold_1();
        plVar26 = pgVar27->lr_ctx->free_lr_list;
        if (plVar26 == (live_range_t_conflict)0x0) {
          plVar26 = (live_range_t_conflict)gen_malloc(pgVar27,0x20);
        }
        else {
          pgVar27->lr_ctx->free_lr_list = plVar26->next;
        }
        if ((int)uVar24 < 0) {
          __assert_fail("start >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        if (extraout_EDX_01 < uVar24) {
          __assert_fail("finish < 0 || start <= finish",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)")
          ;
        }
        plVar26->start = uVar24;
        plVar26->finish = extraout_EDX_01;
        plVar26->ref_cost = 1;
        plVar26->next = (live_range_t)pMVar18;
        plVar26->lr_bb = (lr_bb_t_conflict)0x0;
        return;
      }
      plVar13 = pplVar17[uVar23];
      if (plVar13 != (live_range_t_conflict)0x0) {
        fprintf((FILE *)pgVar27->debug_file,"%lu",uVar23);
        if (*(int *)((long)&((gen_ctx_t)pgVar27->lr_ctx)->ctx + 4) != 0) {
          pFVar4 = (FILE *)pgVar27->debug_file;
          iVar7 = var_to_scan_var((gen_ctx_t)pgVar27->lr_ctx,(MIR_reg_t)uVar23);
          fprintf(pFVar4," (%lu)",(long)iVar7);
        }
        if (0x21 < uVar23) {
          pFVar4 = (FILE *)pgVar27->debug_file;
          MVar32 = (MIR_reg_t)uVar23 - 0x21;
          tp = MIR_reg_type(ctx,MVar32,(pgVar27->curr_func_item->u).func);
          pcVar28 = MIR_type_str(ctx,tp);
          pcVar11 = MIR_reg_name(ctx,MVar32,(pgVar27->curr_func_item->u).func);
          fprintf(pFVar4," (%s:%s)",pcVar28,pcVar11);
        }
        fputc(0x3a,(FILE *)pgVar27->debug_file);
        pcVar28 = (char *)pgVar27;
        print_live_ranges(pgVar27,plVar13);
        plVar12 = pgVar27->lr_ctx;
        plVar26 = plVar13;
      }
      pVVar16 = plVar12->var_live_ranges;
      uVar23 = uVar23 + 1;
    } while (pVVar16 != (VARR_live_range_t *)0x0);
  }
  print_all_live_ranges_cold_2();
  return;
}

Assistant:

static void process_bb_ranges (gen_ctx_t gen_ctx, bb_t bb, MIR_insn_t start_insn,
                               MIR_insn_t tail_insn) {
  MIR_reg_t var, reg, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  size_t nel;
  int scan_var, op_num, incr_p;
  bitmap_iterator_t bi;
  insn_var_iterator_t insn_var_iter;

  DEBUG (2, {
    fprintf (debug_file, "  ------BB%u end: point=%d\n", (unsigned) bb->index, curr_point);
  });
  bitmap_clear (referenced_vars);
  bitmap_clear (live_vars);
  if (bb->live_out != NULL) FOREACH_BITMAP_BIT (bi, bb->live_out, nel) {
      make_var_live (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    }
  for (MIR_insn_t insn = tail_insn;; insn = DLIST_PREV (MIR_insn_t, insn)) {
    DEBUG (2, {
      fprintf (debug_file, "  p%-5d", curr_point);
      MIR_output_insn (gen_ctx->ctx, debug_file, insn, curr_func_item->u.func, TRUE);
    });
    if (insn->code == MIR_PHI) {
      if ((scan_var = var_to_scan_var (gen_ctx, insn->ops[0].u.var)) >= 0) {
        make_var_dead (gen_ctx, insn->ops[0].u.var, scan_var, curr_point, TRUE);
        curr_point++;
      }
      if (insn == start_insn) break;
      continue;
    }
    incr_p = FALSE;
    FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_dead (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0 && MIR_call_code_p (insn->code)) {
      if (incr_p) curr_point++;
      incr_p = FALSE;
      FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
        make_var_dead (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        incr_p = TRUE;
      }
      bitmap_t args = (optimize_level > 0 ? ((bb_insn_t) insn->data)->call_hard_reg_args
                                          : ((insn_data_t) insn->data)->u.call_hard_reg_args);
      if (args != NULL) {
        FOREACH_BITMAP_BIT (bi, args, nel) {
          make_var_live (gen_ctx, (MIR_reg_t) nel, (int) nel, curr_point, TRUE);
        }
      }
      FOREACH_BITMAP_BIT (bi, live_vars, nel) {
        MIR_reg_t live_reg;

        if (nel <= MAX_HARD_REG) continue;
        live_reg = (MIR_reg_t) nel;
        bitmap_set_bit_p (curr_cfg->call_crossed_regs, live_reg);
      }
    }
    if (incr_p) curr_point++;
    incr_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
      if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
      incr_p |= make_var_live (gen_ctx, var, scan_var, curr_point, TRUE);
    }
    if (scan_vars_num == 0) {
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if ((reg = early_clobbered_hard_reg1) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
      if ((reg = early_clobbered_hard_reg2) != MIR_NON_VAR) {
        incr_p |= make_var_live (gen_ctx, reg, (int) reg, curr_point, TRUE);
        incr_p |= make_var_dead (gen_ctx, reg, (int) reg, curr_point, TRUE);
      }
    }
    if (incr_p) curr_point++;
    if (insn == start_insn) break;
  }
  gen_assert (bitmap_equal_p (bb->live_in, live_vars));
  FOREACH_BITMAP_BIT (bi, bb->live_in, nel) {
    make_var_dead (gen_ctx, scan_var_to_var (gen_ctx, (int) nel), (int) nel, curr_point, FALSE);
    if (scan_vars_num == 0 && !bitmap_bit_p (referenced_vars, nel))
      add_lr_bb (gen_ctx, (MIR_reg_t) nel, bb);
  }
  if (scan_vars_num == 0) { /* setup spill info for RA */
    bitmap_clear (bb->spill_gen);
    bitmap_clear (bb->spill_kill);
    FOREACH_BITMAP_BIT (bi, referenced_vars, nel) {
      if (nel > MAX_HARD_REG) bitmap_set_bit_p (bb->spill_kill, nel);
    }
  }
  if (!bitmap_empty_p (bb->live_in)) curr_point++;
}